

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sssort.c
# Opt level: O2

void ss_mintrosort(sauchar_t *T,saidx64_t *PA,saidx64_t *first,saidx64_t *last,saidx64_t depth)

{
  sauchar_t *Td;
  byte bVar1;
  ulong uVar2;
  undefined8 uVar3;
  saint_t sVar4;
  saint_t sVar5;
  ulong *puVar6;
  ulong *puVar7;
  ulong *puVar8;
  ulong *puVar9;
  byte bVar10;
  long lVar11;
  long lVar12;
  undefined8 *puVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  ulong *puVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  bool bVar22;
  long local_270;
  ulong *local_268;
  long local_260;
  ulong local_250;
  anon_struct_32_4_d8a569f3 stack [16];
  
  sVar4 = ss_ilg((long)last - (long)first >> 3);
  local_260 = 0;
  local_268 = (ulong *)first;
  local_270 = depth;
LAB_00102091:
  do {
    local_260 = (long)(int)local_260;
    sVar5 = sVar4;
    while( true ) {
      uVar18 = (long)last - (long)local_268;
      uVar20 = (long)uVar18 >> 3;
      if (8 < (long)uVar20) break;
      if (1 < (long)uVar20) {
        for (puVar7 = (ulong *)last + -2; local_268 <= puVar7; puVar7 = puVar7 + -1) {
          uVar18 = *puVar7;
          uVar20 = puVar7[1];
          puVar8 = puVar7 + 1;
          while (sVar4 = ss_compare(T,PA + uVar18,PA + uVar20,local_270), puVar6 = puVar8, 0 < sVar4
                ) {
            do {
              puVar8 = puVar6 + 1;
              puVar6[-1] = uVar20;
              if (last <= puVar8) goto LAB_00102116;
              uVar20 = *puVar8;
              puVar6 = puVar8;
            } while ((long)uVar20 < 0);
          }
LAB_00102116:
          if (sVar4 == 0) {
            *puVar8 = ~*puVar8;
          }
          puVar8[-1] = uVar18;
        }
      }
      bVar22 = local_260 == 0;
      local_260 = local_260 + -1;
      if (bVar22) {
        return;
      }
      local_268 = (ulong *)stack[local_260].a;
      last = stack[local_260].b;
      local_270 = stack[local_260].c;
      sVar5 = stack[local_260].d;
    }
    Td = T + local_270;
    sVar4 = sVar5 + -1;
    if (sVar5 == 0) {
      if ((uVar18 & 8) == 0) {
        local_250 = uVar20 - 1;
        uVar16 = local_250 >> 1;
        uVar2 = local_268[uVar20 - 1];
        if (Td[PA[local_268[uVar16]]] < Td[PA[uVar2]]) {
          local_268[uVar20 - 1] = local_268[uVar16];
          local_268[uVar16] = uVar2;
        }
      }
      else {
        uVar16 = uVar20 >> 1;
        local_250 = uVar20;
      }
      while (0 < (long)uVar16) {
        uVar16 = uVar16 - 1;
        ss_fixdown(Td,PA,(saidx64_t *)local_268,uVar16,local_250);
      }
      if ((uVar18 & 8) == 0) {
        uVar18 = *local_268;
        *local_268 = local_268[local_250];
        local_268[local_250] = uVar18;
        ss_fixdown(Td,PA,(saidx64_t *)local_268,0,local_250);
      }
      while (uVar18 = local_250 - 1, 1 < (long)local_250) {
        uVar16 = *local_268;
        *local_268 = local_268[uVar18];
        ss_fixdown(Td,PA,(saidx64_t *)local_268,0,uVar18);
        local_268[uVar18] = uVar16;
        local_250 = uVar18;
      }
    }
    iVar19 = (int)local_260;
    if (0 < sVar5) {
      puVar7 = (ulong *)((long)local_268 + (uVar20 & 0xfffffffffffffffe) * 4);
      if ((long)uVar20 < 0x201) {
        if ((long)uVar20 < 0x21) {
          puVar8 = (ulong *)last + -1;
          puVar6 = local_268;
          goto LAB_00102418;
        }
        uVar20 = uVar20 * 2 & 0xfffffffffffffff8;
        puVar8 = (ulong *)last + -1;
        puVar9 = (ulong *)((long)puVar8 - uVar20);
        puVar17 = puVar7;
        uVar18 = *(ulong *)((long)local_268 + uVar20);
        puVar6 = (ulong *)((long)local_268 + uVar20);
        if (Td[PA[*puVar7]] < Td[PA[*(ulong *)((long)local_268 + uVar20)]]) {
          puVar17 = (ulong *)((long)local_268 + uVar20);
          uVar18 = *puVar7;
          puVar6 = puVar7;
        }
        uVar20 = ((ulong *)last)[-1];
        puVar7 = puVar9;
        if (Td[PA[*puVar9]] <= Td[PA[uVar20]]) {
          puVar7 = puVar8;
          uVar20 = *puVar9;
          puVar8 = puVar9;
        }
        puVar9 = puVar7;
        if (Td[PA[uVar20]] < Td[PA[uVar18]]) {
          puVar9 = puVar17;
          puVar8 = puVar6;
          puVar17 = puVar7;
        }
        puVar6 = puVar17;
        uVar18 = *local_268;
        puVar7 = local_268;
        if (Td[PA[*puVar17]] < Td[PA[*local_268]]) {
          puVar6 = local_268;
          uVar18 = *puVar17;
          puVar7 = puVar17;
        }
        if (Td[PA[uVar18]] <= Td[PA[*puVar8]]) {
          puVar7 = puVar8;
          puVar9 = puVar6;
        }
        if (Td[PA[*puVar9]] <= Td[PA[*puVar7]]) {
          puVar7 = puVar9;
        }
      }
      else {
        uVar18 = uVar20 & 0xfffffffffffffff8;
        puVar6 = (ulong *)ss_median3(Td,PA,(saidx64_t *)local_268,
                                     (saidx64_t *)((long)local_268 + uVar18),
                                     (saidx64_t *)(local_268 + (uVar20 >> 3) * 2));
        puVar7 = (ulong *)ss_median3(Td,PA,(saidx64_t *)((long)puVar7 - uVar18),(saidx64_t *)puVar7,
                                     (saidx64_t *)(uVar18 + (long)puVar7));
        puVar8 = (ulong *)last + -1;
        puVar8 = (ulong *)ss_median3(Td,PA,(saidx64_t *)(puVar8 + (uVar20 >> 3) * -2),
                                     (saidx64_t *)((long)puVar8 - uVar18),(saidx64_t *)puVar8);
LAB_00102418:
        puVar7 = (ulong *)ss_median3(Td,PA,(saidx64_t *)puVar6,(saidx64_t *)puVar7,
                                     (saidx64_t *)puVar8);
      }
      bVar1 = Td[PA[*puVar7]];
      uVar18 = *local_268;
      *local_268 = *puVar7;
      *puVar7 = uVar18;
      puVar7 = local_268;
      do {
        puVar7 = puVar7 + 1;
        puVar8 = (ulong *)last;
        puVar6 = puVar7;
        if (last <= puVar7) goto LAB_001025e3;
      } while (Td[PA[*puVar7]] == bVar1);
      if (Td[PA[*puVar7]] < bVar1) {
        while (puVar7 = puVar7 + 1, puVar7 < last) {
          uVar18 = *puVar7;
          if (bVar1 < Td[PA[uVar18]]) break;
          if (Td[PA[uVar18]] == bVar1) {
            *puVar7 = *puVar6;
            *puVar6 = uVar18;
            puVar6 = puVar6 + 1;
          }
        }
      }
LAB_001025e3:
      do {
        puVar8 = puVar8 + -1;
        puVar17 = puVar8;
        if (puVar8 <= puVar7) goto LAB_001026b2;
      } while (Td[PA[*puVar8]] == bVar1);
      if (bVar1 < Td[PA[*puVar8]]) {
        while (puVar9 = puVar8 + -1, puVar7 < puVar9) {
          uVar18 = *puVar9;
          if (Td[PA[uVar18]] < bVar1) break;
          puVar8 = puVar9;
          if (Td[PA[uVar18]] == bVar1) {
            *puVar9 = *puVar17;
            *puVar17 = uVar18;
            puVar17 = puVar17 + -1;
          }
        }
        puVar8 = puVar8 + -1;
      }
LAB_001026b2:
      if (puVar7 < puVar8) {
        uVar18 = *puVar7;
        *puVar7 = *puVar8;
        *puVar8 = uVar18;
        while (puVar7 = puVar7 + 1, puVar7 < puVar8) {
          uVar18 = *puVar7;
          if (bVar1 < Td[PA[uVar18]]) break;
          if (Td[PA[uVar18]] == bVar1) {
            *puVar7 = *puVar6;
            *puVar6 = uVar18;
            puVar6 = puVar6 + 1;
          }
        }
LAB_0010269b:
        puVar8 = puVar8 + -1;
        if (puVar7 < puVar8) {
          uVar18 = *puVar8;
          if (Td[PA[uVar18]] < bVar1) goto LAB_001026b2;
          if (Td[PA[uVar18]] == bVar1) {
            *puVar8 = *puVar17;
            *puVar17 = uVar18;
            puVar17 = puVar17 + -1;
          }
          goto LAB_0010269b;
        }
        goto LAB_001026b2;
      }
      if (puVar17 < puVar6) {
        if (Td[PA[*local_268] + -1] < bVar1) {
          local_268 = (ulong *)ss_partition(PA,(saidx64_t *)local_268,last,local_270);
          sVar5 = ss_ilg((long)last - (long)local_268 >> 3);
        }
        local_270 = local_270 + 1;
        local_268 = local_268;
        sVar4 = sVar5;
      }
      else {
        lVar11 = (long)puVar6 - (long)local_268 >> 3;
        lVar21 = (long)puVar7 - (long)puVar6 >> 3;
        if (lVar21 <= lVar11) {
          lVar11 = lVar21;
        }
        lVar14 = 0;
        for (lVar12 = lVar11; 0 < lVar12; lVar12 = lVar12 + -1) {
          uVar3 = *(undefined8 *)((long)local_268 + lVar14);
          *(undefined8 *)((long)local_268 + lVar14) =
               *(undefined8 *)((long)puVar7 + lVar14 + lVar11 * -8);
          *(undefined8 *)((long)puVar7 + lVar14 + lVar11 * -8) = uVar3;
          lVar14 = lVar14 + 8;
        }
        lVar14 = (long)puVar17 + (8 - (long)puVar7) >> 3;
        lVar12 = (long)last - (long)puVar17 >> 3;
        lVar11 = lVar12 + -1;
        if (lVar14 < lVar12) {
          lVar11 = lVar14;
        }
        lVar15 = 0;
        for (lVar12 = lVar11; 0 < lVar12; lVar12 = lVar12 + -1) {
          uVar3 = *(undefined8 *)((long)puVar7 + lVar15);
          *(undefined8 *)((long)puVar7 + lVar15) =
               *(undefined8 *)((long)last + lVar15 + lVar11 * -8);
          *(undefined8 *)((long)last + lVar15 + lVar11 * -8) = uVar3;
          lVar15 = lVar15 + 8;
        }
        puVar7 = local_268 + lVar21;
        puVar6 = (ulong *)last + -lVar14;
        puVar8 = puVar7;
        if (Td[PA[*puVar7] + -1] < bVar1) {
          puVar8 = (ulong *)ss_partition(PA,(saidx64_t *)puVar7,(saidx64_t *)puVar6,local_270);
        }
        lVar11 = (long)puVar6 - (long)puVar8 >> 3;
        if (lVar14 < lVar21) {
          if (lVar11 < lVar21) {
            lVar21 = (local_260 << 0x20) + 0x100000000 >> 0x1b;
            stack[iVar19].a = (saidx64_t *)local_268;
            stack[iVar19].b = (saidx64_t *)puVar7;
            stack[iVar19].c = local_270;
            stack[iVar19].d = sVar4;
            puVar13 = (undefined8 *)((long)&stack[0].a + lVar21);
            if (lVar11 < lVar14) {
              *puVar13 = puVar6;
              *(saidx64_t **)((long)&stack[0].b + lVar21) = last;
              *(long *)((long)&stack[0].c + lVar21) = local_270;
              local_260 = local_260 + 2;
              *(saint_t *)((long)&stack[0].d + lVar21) = sVar4;
              local_270 = local_270 + 1;
              sVar4 = ss_ilg(lVar11);
              local_268 = puVar8;
              last = (saidx64_t *)puVar6;
            }
            else {
              *puVar13 = puVar8;
              *(ulong **)((long)&stack[0].b + lVar21) = puVar6;
              *(long *)((long)&stack[0].c + lVar21) = local_270 + 1;
              sVar5 = ss_ilg(lVar11);
              local_260 = local_260 + 2;
              *(saint_t *)((long)&stack[0].d + lVar21) = sVar5;
              local_268 = puVar6;
            }
          }
          else {
            stack[iVar19].a = (saidx64_t *)puVar8;
            stack[iVar19].b = (saidx64_t *)puVar6;
            stack[iVar19].c = local_270 + 1;
            sVar5 = ss_ilg(lVar11);
            stack[iVar19].d = sVar5;
            lVar11 = (local_260 << 0x20) + 0x100000000 >> 0x1b;
            *(ulong **)((long)&stack[0].a + lVar11) = local_268;
            *(ulong **)((long)&stack[0].b + lVar11) = puVar7;
            *(long *)((long)&stack[0].c + lVar11) = local_270;
            local_260 = local_260 + 2;
            *(saint_t *)((long)&stack[0].d + lVar11) = sVar4;
            local_268 = puVar6;
          }
        }
        else if (lVar11 < lVar14) {
          lVar12 = (local_260 << 0x20) + 0x100000000 >> 0x1b;
          stack[iVar19].a = (saidx64_t *)puVar6;
          stack[iVar19].b = last;
          stack[iVar19].c = local_270;
          stack[iVar19].d = sVar4;
          puVar13 = (undefined8 *)((long)&stack[0].a + lVar12);
          if (lVar11 < lVar21) {
            *puVar13 = local_268;
            *(ulong **)((long)&stack[0].b + lVar12) = puVar7;
            *(long *)((long)&stack[0].c + lVar12) = local_270;
            local_260 = local_260 + 2;
            *(saint_t *)((long)&stack[0].d + lVar12) = sVar4;
            local_270 = local_270 + 1;
            sVar4 = ss_ilg(lVar11);
            local_268 = puVar8;
            last = (saidx64_t *)puVar6;
          }
          else {
            *puVar13 = puVar8;
            *(ulong **)((long)&stack[0].b + lVar12) = puVar6;
            *(long *)((long)&stack[0].c + lVar12) = local_270 + 1;
            sVar5 = ss_ilg(lVar11);
            local_260 = local_260 + 2;
            *(saint_t *)((long)&stack[0].d + lVar12) = sVar5;
            last = (saidx64_t *)puVar7;
          }
        }
        else {
          stack[iVar19].a = (saidx64_t *)puVar8;
          stack[iVar19].b = (saidx64_t *)puVar6;
          stack[iVar19].c = local_270 + 1;
          sVar5 = ss_ilg(lVar11);
          stack[iVar19].d = sVar5;
          lVar11 = (local_260 << 0x20) + 0x100000000 >> 0x1b;
          *(ulong **)((long)&stack[0].a + lVar11) = puVar6;
          *(saidx64_t **)((long)&stack[0].b + lVar11) = last;
          *(long *)((long)&stack[0].c + lVar11) = local_270;
          local_260 = local_260 + 2;
          *(saint_t *)((long)&stack[0].d + lVar11) = sVar4;
          last = (saidx64_t *)puVar7;
        }
      }
      goto LAB_00102091;
    }
    bVar1 = Td[PA[*local_268]];
    do {
      bVar10 = bVar1;
      puVar7 = local_268;
      lVar11 = 0;
      do {
        lVar21 = lVar11;
        puVar8 = (ulong *)((long)puVar7 + lVar21 + 8);
        if (last <= puVar8) goto LAB_001022f0;
        lVar11 = lVar21 + 8;
      } while (bVar10 == Td[PA[*puVar8]]);
      local_268 = (ulong *)(lVar11 + (long)puVar7);
      bVar1 = Td[PA[*puVar8]];
    } while (lVar11 < 9);
LAB_001022f0:
    puVar6 = (ulong *)((long)puVar7 + lVar21 + 8);
    puVar8 = puVar7;
    if (Td[PA[*puVar7] + -1] < bVar10) {
      puVar8 = (ulong *)ss_partition(PA,(saidx64_t *)puVar7,(saidx64_t *)puVar6,local_270);
    }
    lVar12 = (long)puVar7 + (lVar21 - (long)puVar8) + 8 >> 3;
    lVar11 = (long)last + (-lVar21 - (long)puVar7) + -8 >> 3;
    local_268 = puVar6;
    if (lVar11 < lVar12) {
      if (lVar11 < 2) {
        local_270 = local_270 + 1;
        sVar4 = ss_ilg(lVar12);
        local_268 = puVar8;
        last = (saidx64_t *)puVar6;
      }
      else {
        stack[iVar19].a = (saidx64_t *)puVar8;
        stack[iVar19].b = (saidx64_t *)puVar6;
        stack[iVar19].c = local_270 + 1;
        sVar4 = ss_ilg(lVar12);
        local_260 = local_260 + 1;
        stack[iVar19].d = sVar4;
        sVar4 = -1;
      }
    }
    else {
      sVar4 = -1;
      if (1 < lVar12) {
        stack[iVar19].a = (saidx64_t *)puVar6;
        stack[iVar19].b = last;
        stack[iVar19].c = local_270;
        local_260 = local_260 + 1;
        stack[iVar19].d = -1;
        local_270 = local_270 + 1;
        sVar4 = ss_ilg(lVar12);
        local_268 = puVar8;
        last = (saidx64_t *)puVar6;
      }
    }
  } while( true );
}

Assistant:

static
void
ss_mintrosort(const sauchar_t *T, const saidx_t *PA,
              saidx_t *first, saidx_t *last,
              saidx_t depth) {
#define STACK_SIZE SS_MISORT_STACKSIZE
  struct { saidx_t *a, *b, c; saint_t d; } stack[STACK_SIZE];
  const sauchar_t *Td;
  saidx_t *a, *b, *c, *d, *e, *f;
  saidx_t s, t;
  saint_t ssize;
  saint_t limit;
  saint_t v, x = 0;

  for(ssize = 0, limit = ss_ilg(last - first);;) {

    if((last - first) <= SS_INSERTIONSORT_THRESHOLD) {
#if 1 < SS_INSERTIONSORT_THRESHOLD
      if(1 < (last - first)) { ss_insertionsort(T, PA, first, last, depth); }
#endif
      STACK_POP(first, last, depth, limit);
      continue;
    }

    Td = T + depth;
    if(limit-- == 0) { ss_heapsort(Td, PA, first, last - first); }
    if(limit < 0) {
      for(a = first + 1, v = Td[PA[*first]]; a < last; ++a) {
        if((x = Td[PA[*a]]) != v) {
          if(1 < (a - first)) { break; }
          v = x;
          first = a;
        }
      }
      if(Td[PA[*first] - 1] < v) {
        first = ss_partition(PA, first, a, depth);
      }
      if((a - first) <= (last - a)) {
        if(1 < (a - first)) {
          STACK_PUSH(a, last, depth, -1);
          last = a, depth += 1, limit = ss_ilg(a - first);
        } else {
          first = a, limit = -1;
        }
      } else {
        if(1 < (last - a)) {
          STACK_PUSH(first, a, depth + 1, ss_ilg(a - first));
          first = a, limit = -1;
        } else {
          last = a, depth += 1, limit = ss_ilg(a - first);
        }
      }
      continue;
    }

    /* choose pivot */
    a = ss_pivot(Td, PA, first, last);
    v = Td[PA[*a]];
    SWAP(*first, *a);

    /* partition */
    for(b = first; (++b < last) && ((x = Td[PA[*b]]) == v);) { }
    if(((a = b) < last) && (x < v)) {
      for(; (++b < last) && ((x = Td[PA[*b]]) <= v);) {
        if(x == v) { SWAP(*b, *a); ++a; }
      }
    }
    for(c = last; (b < --c) && ((x = Td[PA[*c]]) == v);) { }
    if((b < (d = c)) && (x > v)) {
      for(; (b < --c) && ((x = Td[PA[*c]]) >= v);) {
        if(x == v) { SWAP(*c, *d); --d; }
      }
    }
    for(; b < c;) {
      SWAP(*b, *c);
      for(; (++b < c) && ((x = Td[PA[*b]]) <= v);) {
        if(x == v) { SWAP(*b, *a); ++a; }
      }
      for(; (b < --c) && ((x = Td[PA[*c]]) >= v);) {
        if(x == v) { SWAP(*c, *d); --d; }
      }
    }

    if(a <= d) {
      c = b - 1;

      if((s = a - first) > (t = b - a)) { s = t; }
      for(e = first, f = b - s; 0 < s; --s, ++e, ++f) { SWAP(*e, *f); }
      if((s = d - c) > (t = last - d - 1)) { s = t; }
      for(e = b, f = last - s; 0 < s; --s, ++e, ++f) { SWAP(*e, *f); }

      a = first + (b - a), c = last - (d - c);
      b = (v <= Td[PA[*a] - 1]) ? a : ss_partition(PA, a, c, depth);

      if((a - first) <= (last - c)) {
        if((last - c) <= (c - b)) {
          STACK_PUSH(b, c, depth + 1, ss_ilg(c - b));
          STACK_PUSH(c, last, depth, limit);
          last = a;
        } else if((a - first) <= (c - b)) {
          STACK_PUSH(c, last, depth, limit);
          STACK_PUSH(b, c, depth + 1, ss_ilg(c - b));
          last = a;
        } else {
          STACK_PUSH(c, last, depth, limit);
          STACK_PUSH(first, a, depth, limit);
          first = b, last = c, depth += 1, limit = ss_ilg(c - b);
        }
      } else {
        if((a - first) <= (c - b)) {
          STACK_PUSH(b, c, depth + 1, ss_ilg(c - b));
          STACK_PUSH(first, a, depth, limit);
          first = c;
        } else if((last - c) <= (c - b)) {
          STACK_PUSH(first, a, depth, limit);
          STACK_PUSH(b, c, depth + 1, ss_ilg(c - b));
          first = c;
        } else {
          STACK_PUSH(first, a, depth, limit);
          STACK_PUSH(c, last, depth, limit);
          first = b, last = c, depth += 1, limit = ss_ilg(c - b);
        }
      }
    } else {
      limit += 1;
      if(Td[PA[*first] - 1] < v) {
        first = ss_partition(PA, first, last, depth);
        limit = ss_ilg(last - first);
      }
      depth += 1;
    }
  }
#undef STACK_SIZE
}